

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

int zt_opt_string_array(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error
                       )

{
  long lVar1;
  char *pcVar2;
  void *pvVar3;
  int in_ESI;
  long in_R8;
  char **in_R9;
  int i;
  int offt;
  int size;
  char **new_array;
  char **cur_array;
  char *arg;
  int args_consumed;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int iVar4;
  int iVar5;
  zt_opt_error in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int iVar6;
  
  iVar6 = 0;
  pcVar2 = zt_opt_get_value((int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9,
                            (zt_opt_def_t *)(ulong)in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pcVar2 != (char *)0x0) {
    lVar1 = **(long **)(in_R8 + (long)in_ESI * 0x30 + 0x20);
    iVar4 = 0;
    iVar5 = 1;
    if (lVar1 != 0) {
      in_stack_ffffffffffffffac = 0;
      do {
        iVar4 = in_stack_ffffffffffffffac;
        in_stack_ffffffffffffffac = iVar4 + 1;
        iVar5 = in_stack_ffffffffffffffac;
      } while (*(long *)(lVar1 + (long)iVar4 * 8) != 0);
    }
    pvVar3 = zt_realloc_p((void_p)CONCAT44(iVar5,iVar4),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pvVar3 == (void *)0x0) {
      zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"could not allocate memory for array");
      exit(1);
    }
    pcVar2 = strdup(pcVar2);
    *(char **)((long)pvVar3 + (long)iVar4 * 8) = pcVar2;
    *(undefined8 *)((long)pvVar3 + (long)(iVar4 + 1) * 8) = 0;
    **(undefined8 **)(in_R8 + (long)in_ESI * 0x30 + 0x20) = pvVar3;
  }
  return iVar6;
}

Assistant:

int
zt_opt_string_array(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    int    args_consumed = 0;
    char * arg           = zt_opt_get_value(argn, defn, argv, def, &args_consumed, error);

    if (arg) {
        char ** cur_array = *(char***)def[defn].cb_data;
        char ** new_array = 0;
        int     size      = 1;
        int     offt      = 0;

        if (cur_array != NULL) {
            int i = 0;
            while (cur_array[i++] != NULL) {
                ;
            }
            size = i;
            offt = i - 1;
        }

        if ((new_array = zt_realloc(char *, cur_array, size + 1)) == NULL) {
            zt_log_printf(zt_log_crit, "could not allocate memory for array");
            exit(1);
        }

        new_array[offt]             = strdup(arg);
        new_array[offt + 1]         = NULL;

        *(char***)def[defn].cb_data = new_array;
    }

    return args_consumed;
}